

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::i2p_stream::
send_session_create<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  uint uVar1;
  uint uVar2;
  mutable_buffer local_200;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:433:4),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_1f0;
  offset_in_http_connection_to_subr local_1c8;
  undefined8 uStack_1c0;
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  char cmd [400];
  
  this->m_state = read_session_create_response;
  uVar2 = snprintf(cmd,400,
                   "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 inbound.quantity=%d outbound.quantity=%d inbound.length=%d outbound.length=%d\n"
                   ,this->m_id,(ulong)(uint)(this->m_session_options).m_inbound_quantity,
                   (ulong)(uint)(this->m_session_options).m_outbound_quantity,
                   (ulong)(uint)(this->m_session_options).m_inbound_length,
                   (ulong)(uint)(this->m_session_options).m_outbound_length);
  uVar1 = 400;
  if (uVar2 < 400) {
    uVar1 = uVar2;
  }
  local_200.size_ = (size_t)uVar1;
  local_1c8 = h->_M_f;
  uStack_1c0 = *(undefined8 *)&h->field_0x8;
  local_1b8 = (h->_M_bound_args).
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  _Stack_1b0._M_pi =
       (h->_M_bound_args).
       super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl
       .super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (h->_M_bound_args).
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_200.data_ = cmd;
  aux::
  wrap_allocator<libtorrent::i2p_stream::send_session_create<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
            (&local_1f0,(aux *)this,(i2p_stream *)&local_1c8,
             (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)local_200.size_);
  boost::asio::
  async_write<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::i2p_stream::send_session_create<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
            ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
              *)this,&local_200,&local_1f0,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_1f0.m_underlying_handler._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
                     .
                     super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                     ._M_head_impl + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b0);
  return;
}

Assistant:

void send_session_create(Handler h)
	{
		TORRENT_ASSERT(m_magic == 0x1337);
		m_state = read_session_create_response;
		char cmd[400];
		int size = std::snprintf(cmd, sizeof(cmd),
			"SESSION CREATE STYLE=STREAM ID=%s "
			"DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 "
			"inbound.quantity=%d outbound.quantity=%d inbound.length=%d outbound.length=%d\n",
			m_id, m_session_options.m_inbound_quantity, m_session_options.m_outbound_quantity,
			m_session_options.m_inbound_length, m_session_options.m_outbound_length);
		ADD_OUTSTANDING_ASYNC("i2p_stream::start_read_line");
		async_write(m_sock, boost::asio::buffer(cmd, std::size_t(size)), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				start_read_line(ec, std::move(hn));
			}, std::move(h)));
	}